

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_slice_header(bitstream *str,h264_seqparm **seqparms,h264_picparm **picparms,
                     h264_slice *slice)

{
  int iVar1;
  uint idr_pic_flag;
  int iVar2;
  bitstream *in_RCX;
  long in_RDX;
  long in_RSI;
  uint32_t *in_RDI;
  h264_slice *in_stack_00000018;
  uint32_t pic_parameter_set_id;
  uint32_t slice_type;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  h264_slice *in_stack_ffffffffffffffb0;
  h264_slice *in_stack_ffffffffffffffb8;
  bitstream *str_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->nal_ref_idc);
  if (iVar1 == 0) {
    idr_pic_flag = *(int *)&in_RCX[1].bytes + *(int *)((long)&in_RCX[1].bytes + 4) * 5;
    iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->nal_ref_idc);
    if (iVar1 == 0) {
      *(uint *)&in_RCX[1].bytes = idr_pic_flag % 5;
      *(uint *)((long)&in_RCX[1].bytes + 4) = idr_pic_flag / 5;
      if (*in_RDI == 0) {
        in_stack_ffffffffffffffd0 = **(uint **)(in_RCX + 1);
      }
      iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->nal_ref_idc);
      if (iVar1 == 0) {
        if (*in_RDI == 1) {
          if (0xff < in_stack_ffffffffffffffd0) {
            fprintf(_stderr,"pic_parameter_set_id out of range\n");
            return 1;
          }
          *(undefined8 *)(in_RCX + 1) =
               *(undefined8 *)(in_RDX + (ulong)in_stack_ffffffffffffffd0 * 8);
          if (*(long *)(in_RCX + 1) == 0) {
            fprintf(_stderr,"pic_parameter_set_id doesn\'t specify a picparm\n");
            return 1;
          }
          *(undefined8 *)&in_RCX->hasbyte =
               *(undefined8 *)(in_RSI + (ulong)*(uint *)(*(long *)(in_RCX + 1) + 4) * 8);
          if (*(long *)&in_RCX->hasbyte == 0) {
            fprintf(_stderr,"seq_parameter_set_id doesn\'t specify a seqparm\n");
            return 1;
          }
          if (*(int *)&in_RCX->field_0x4 == 0x13) {
            *(undefined4 *)&in_RCX[0x37].field_0x4 = 0;
            *(undefined4 *)&in_RCX[0x37].bytes = *(undefined4 *)(*(long *)&in_RCX->hasbyte + 0xcc8);
            *(undefined4 *)((long)&in_RCX[0x37].bytes + 4) = 0;
          }
          else {
            if (*(int *)(*(long *)&in_RCX->hasbyte + 0x14) == 0) {
              in_stack_ffffffffffffffcc = *(undefined4 *)(*(long *)&in_RCX->hasbyte + 0x10);
            }
            else {
              in_stack_ffffffffffffffcc = 0;
            }
            *(undefined4 *)&in_RCX[0x37].field_0x4 = in_stack_ffffffffffffffcc;
            *(undefined4 *)&in_RCX[0x37].bytes = *(undefined4 *)(*(long *)&in_RCX->hasbyte + 0x18);
            *(undefined4 *)((long)&in_RCX[0x37].bytes + 4) =
                 *(undefined4 *)(*(long *)&in_RCX->hasbyte + 0x1c);
          }
          in_RCX[0x37].bytesnum = *(int *)(*(long *)&in_RCX->hasbyte + 0xc28) + 1;
        }
        if ((*(int *)(*(long *)&in_RCX->hasbyte + 0x14) == 0) ||
           (iVar1 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                         &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac),
           iVar1 == 0)) {
          iVar1 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                       &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
          if (iVar1 == 0) {
            if (*(int *)(*(long *)&in_RCX->hasbyte + 0xc30) == 0) {
              iVar1 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                           &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
              if (iVar1 != 0) {
                return 1;
              }
            }
            else {
              iVar1 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                               &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
              if (iVar1 != 0) {
                return 1;
              }
            }
            if (*(int *)&in_RCX[1].curbyte == 0) {
              iVar1 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                               &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
              if (iVar1 != 0) {
                return 1;
              }
            }
            else {
              iVar1 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                           &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
              if (iVar1 != 0) {
                return 1;
              }
            }
            in_RCX[0x37].bytesmax = *(int *)(*(long *)&in_RCX->hasbyte + 0xc2c) + 1;
            if (*(int *)(*(long *)&in_RCX->hasbyte + 0xc30) == 0) {
              in_RCX[0x37].bytesmax = in_RCX[0x37].bytesmax << 1;
            }
            if (*(int *)&in_RCX[1].curbyte != 0) {
              in_RCX[0x37].bytesmax = (uint)in_RCX[0x37].bytesmax >> 1;
            }
            *(int *)&in_RCX[0x37].curbyte = in_RCX[0x37].bytesnum * in_RCX[0x37].bytesmax;
            uVar3 = in_stack_ffffffffffffffc8;
            if (*in_RDI == 1) {
              uVar3 = in_stack_ffffffffffffffc8 & 0xffffff;
              if (*(int *)(*(long *)&in_RCX->hasbyte + 0xc34) != 0) {
                uVar3 = CONCAT13(*(int *)&in_RCX[1].curbyte != 0,(int3)in_stack_ffffffffffffffc8) ^
                        0xff000000;
              }
              in_RCX[0x37].bytepos = (uint)((byte)(uVar3 >> 0x18) & 1);
            }
            if ((in_RCX[0x37].dir == VS_ENCODE) ||
               (iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                              &in_stack_ffffffffffffffb0->nal_ref_idc), iVar1 == 0)) {
              iVar1 = *(int *)(*(long *)&in_RCX->hasbyte + 0x80c);
              if (iVar1 == 0) {
                iVar2 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                             &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
                if (iVar2 != 0) {
                  return 1;
                }
                if ((*(int *)(*(long *)(in_RCX + 1) + 0xc) == 0) ||
                   (*(int *)&in_RCX[1].curbyte != 0)) {
                  iVar2 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                    (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
                else {
                  iVar2 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                (int32_t *)in_stack_ffffffffffffffb0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
              }
              else if (iVar1 == 1) {
                if (*(int *)(*(long *)&in_RCX->hasbyte + 0x814) == 0) {
                  iVar2 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                (int32_t *)in_stack_ffffffffffffffb0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if ((*(int *)(*(long *)(in_RCX + 1) + 0xc) == 0) ||
                     (*(int *)&in_RCX[1].curbyte != 0)) {
                    iVar2 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                      (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                                     );
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                  (int32_t *)in_stack_ffffffffffffffb0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                }
                else {
                  iVar2 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                    (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  iVar2 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                    (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
              }
              if (*(int *)(*(long *)(in_RCX + 1) + 0xb4) == 0) {
                iVar2 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                                 &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
                if (iVar2 != 0) {
                  return 1;
                }
              }
              else {
                iVar2 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                              &in_stack_ffffffffffffffb0->nal_ref_idc);
                if (iVar2 != 0) {
                  return 1;
                }
              }
              if ((*(int *)(*(long *)&in_RCX->hasbyte + 0xc58) == 0) ||
                 (*(int *)&in_RCX->curbyte == 0)) {
                if ((*(int *)&in_RCX[1].bytes == 1) &&
                   (iVar2 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                                 &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac),
                   iVar2 != 0)) {
                  return 1;
                }
                if ((*(int *)&in_RCX[1].bytes != 2) && (*(int *)&in_RCX[1].bytes != 4)) {
                  iVar2 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                               &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if (*(int *)&in_RCX[2].field_0x4 == 0) {
                    iVar2 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                                     &in_stack_ffffffffffffffb0->nal_ref_idc,
                                     in_stack_ffffffffffffffac);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    if ((*(int *)&in_RCX[1].bytes == 1) &&
                       (iVar2 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                                         &in_stack_ffffffffffffffb0->nal_ref_idc,
                                         in_stack_ffffffffffffffac), iVar2 != 0)) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                                  &in_stack_ffffffffffffffb0->nal_ref_idc);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    if ((*(int *)&in_RCX[1].bytes == 1) &&
                       (iVar2 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                                      &in_stack_ffffffffffffffb0->nal_ref_idc), iVar2 != 0)) {
                      return 1;
                    }
                  }
                  if (0x1f < *(uint *)&in_RCX[2].bytes) {
                    fprintf(_stderr,"num_ref_idx_l0_active_minus1 out of range\n");
                    return 1;
                  }
                  if (0x1f < *(uint *)((long)&in_RCX[2].bytes + 4)) {
                    fprintf(_stderr,"num_ref_idx_l1_active_minus1 out of range\n");
                    return 1;
                  }
                  iVar2 = h264_ref_pic_list_modification
                                    ((bitstream *)in_stack_ffffffffffffffb8,
                                     in_stack_ffffffffffffffb0,
                                     (h264_ref_pic_list_modification *)
                                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if ((*(int *)&in_RCX[1].bytes == 1) &&
                     (iVar2 = h264_ref_pic_list_modification
                                        ((bitstream *)in_stack_ffffffffffffffb8,
                                         in_stack_ffffffffffffffb0,
                                         (h264_ref_pic_list_modification *)
                                         CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8)), iVar2 != 0)) {
                    return 1;
                  }
                }
                if (((*(int *)(*(long *)(in_RCX + 1) + 0x98) != 0) &&
                    ((*(int *)&in_RCX[1].bytes == 0 || (*(int *)&in_RCX[1].bytes == 3)))) ||
                   ((*(int *)(*(long *)(in_RCX + 1) + 0x9c) == 1 && (*(int *)&in_RCX[1].bytes == 1))
                   )) {
                  if ((*(int *)(*(long *)&in_RCX->hasbyte + 0xc58) == 0) || (in_RCX->bytesnum != 0))
                  {
                    iVar2 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                                     &in_stack_ffffffffffffffb0->nal_ref_idc,
                                     in_stack_ffffffffffffffac);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                                 &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  if ((in_RCX[0x10].bytepos == 0) &&
                     (iVar1 = h264_pred_weight_table
                                        ((bitstream *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                                         in_stack_ffffffffffffffb8,
                                         (h264_pred_weight_table *)in_stack_ffffffffffffffb0),
                     iVar1 != 0)) {
                    return 1;
                  }
                }
                if (in_RCX->dir != VS_ENCODE) {
                  iVar1 = h264_dec_ref_pic_marking
                                    (in_RCX,idr_pic_flag,
                                     (h264_dec_ref_pic_marking *)
                                     CONCAT44(in_stack_ffffffffffffffcc,uVar3));
                  if (iVar1 != 0) {
                    return 1;
                  }
                  if (((*(int *)(*(long *)&in_RCX->hasbyte + 0xc58) != 0) &&
                      (*(int *)(*(long *)&in_RCX->hasbyte + 0xc8c) == 0)) &&
                     (iVar1 = h264_dec_ref_base_pic_marking
                                        (in_RCX,(h264_nal_svc_header *)
                                                CONCAT44(idr_pic_flag,in_stack_ffffffffffffffd0),
                                         (h264_dec_ref_base_pic_marking *)
                                         CONCAT44(in_stack_ffffffffffffffcc,uVar3)), iVar1 != 0)) {
                    return 1;
                  }
                }
              }
              if (((*(int *)(*(long *)(in_RCX + 1) + 8) != 0) && (*(int *)&in_RCX[1].bytes != 2)) &&
                 (*(int *)&in_RCX[1].bytes != 4)) {
                iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                              &in_stack_ffffffffffffffb0->nal_ref_idc);
                if (iVar1 != 0) {
                  return 1;
                }
                if (2 < (uint)in_RCX[0x36].zero_bytes) {
                  fprintf(_stderr,"cabac_init_idc out of range!\n");
                  return 1;
                }
              }
              iVar1 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                            (int32_t *)in_stack_ffffffffffffffb0);
              if (iVar1 == 0) {
                in_RCX[0x37].bitpos =
                     *(int *)(*(long *)(in_RCX + 1) + 0xa0) + 0x1a + *(int *)&in_RCX[0x36].curbyte;
                if ((*(int *)&in_RCX[1].bytes == 3) &&
                   (iVar1 = vs_u((bitstream *)in_stack_ffffffffffffffb8,
                                 &in_stack_ffffffffffffffb0->nal_ref_idc,in_stack_ffffffffffffffac),
                   iVar1 != 0)) {
                  local_4 = 1;
                }
                else if (((*(int *)&in_RCX[1].bytes == 3) || (*(int *)&in_RCX[1].bytes == 4)) &&
                        (iVar1 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                       (int32_t *)in_stack_ffffffffffffffb0), iVar1 != 0)) {
                  local_4 = 1;
                }
                else {
                  if (*(int *)(*(long *)(in_RCX + 1) + 0xac) == 0) {
                    iVar1 = vs_infer((bitstream *)in_stack_ffffffffffffffb8,
                                     &in_stack_ffffffffffffffb0->nal_ref_idc,
                                     in_stack_ffffffffffffffac);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    iVar1 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                      (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                                     );
                    if (iVar1 != 0) {
                      return 1;
                    }
                    iVar1 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                      (int32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                                     );
                    if (iVar1 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar1 = vs_ue((bitstream *)in_stack_ffffffffffffffb8,
                                  &in_stack_ffffffffffffffb0->nal_ref_idc);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    if (in_RCX[0x36].zero_bits == 1) {
                      iVar1 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                        (int32_t *)in_stack_ffffffffffffffb0,
                                        in_stack_ffffffffffffffac);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      iVar1 = vs_infers((bitstream *)in_stack_ffffffffffffffb8,
                                        (int32_t *)in_stack_ffffffffffffffb0,
                                        in_stack_ffffffffffffffac);
                      if (iVar1 != 0) {
                        return 1;
                      }
                    }
                    else {
                      iVar1 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                    (int32_t *)in_stack_ffffffffffffffb0);
                      if (iVar1 != 0) {
                        return 1;
                      }
                      iVar1 = vs_se((bitstream *)in_stack_ffffffffffffffb8,
                                    (int32_t *)in_stack_ffffffffffffffb0);
                      if (iVar1 != 0) {
                        return 1;
                      }
                    }
                  }
                  if (((*(int *)(*(long *)(in_RCX + 1) + 0x10) != 0) &&
                      (2 < *(uint *)(*(long *)(in_RCX + 1) + 0x14))) &&
                     (*(uint *)(*(long *)(in_RCX + 1) + 0x14) < 6)) {
                    str_00 = (bitstream *)&in_RCX[0x36].field_0x34;
                    clog2((uint)((*(int *)(*(long *)&in_RCX->hasbyte + 0xc28) + 1) *
                                 (*(int *)(*(long *)&in_RCX->hasbyte + 0xc2c) + 1) +
                                *(int *)(*(long *)(in_RCX + 1) + 0x7c)) /
                          (*(int *)(*(long *)(in_RCX + 1) + 0x7c) + 1U) + 1);
                    iVar1 = vs_u(str_00,in_RDI,in_stack_ffffffffffffffac);
                    if (iVar1 != 0) {
                      return 1;
                    }
                  }
                  if ((*(int *)(*(long *)(in_RCX + 1) + 0x10) == 0) ||
                     (iVar1 = h264_prep_sgmap(in_stack_00000018), iVar1 == 0)) {
                    if (*(int *)(*(long *)&in_RCX->hasbyte + 0xc58) == 0) {
                      local_4 = 0;
                    }
                    else {
                      fprintf(_stderr,"SVC\n");
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_slice_header(struct bitstream *str, struct h264_seqparm **seqparms, struct h264_picparm **picparms, struct h264_slice *slice) {
	if (vs_ue(str, &slice->first_mb_in_slice)) return 1;
	uint32_t slice_type = slice->slice_type + slice->slice_all_same * 5;
	if (vs_ue(str, &slice_type)) return 1;
	slice->slice_type = slice_type % 5;
	slice->slice_all_same = slice_type / 5;
	uint32_t pic_parameter_set_id;
	if (str->dir == VS_ENCODE)
		pic_parameter_set_id = slice->picparm->pic_parameter_set_id;
	if (vs_ue(str, &pic_parameter_set_id)) return 1;
	if (str->dir == VS_DECODE) {
		if (pic_parameter_set_id > 255) {
			fprintf(stderr, "pic_parameter_set_id out of range\n");
			return 1;
		}
		slice->picparm = picparms[pic_parameter_set_id];
		if (!slice->picparm) {
			fprintf(stderr, "pic_parameter_set_id doesn't specify a picparm\n");
			return 1;
		}
		slice->seqparm = seqparms[slice->picparm->seq_parameter_set_id];
		if (!slice->seqparm) {
			fprintf(stderr, "seq_parameter_set_id doesn't specify a seqparm\n");
			return 1;
		}
		if (slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_AUX) {
			slice->chroma_array_type = 0;
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_aux_minus8;
			slice->bit_depth_chroma_minus8 = 0;
		} else {
			slice->chroma_array_type = (slice->seqparm->separate_colour_plane_flag?0:slice->seqparm->chroma_format_idc);
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_luma_minus8;
			slice->bit_depth_chroma_minus8 = slice->seqparm->bit_depth_chroma_minus8;
		}
		slice->pic_width_in_mbs = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	}
	if (slice->seqparm->separate_colour_plane_flag)
		if (vs_u(str, &slice->colour_plane_id, 2)) return 1;
	if (vs_u(str, &slice->frame_num, slice->seqparm->log2_max_frame_num_minus4 + 4)) return 1;
	if (!slice->seqparm->frame_mbs_only_flag) {
		if (vs_u(str, &slice->field_pic_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->field_pic_flag, 0)) return 1;
	}
	if (slice->field_pic_flag) {
		if (vs_u(str, &slice->bottom_field_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->bottom_field_flag, 0)) return 1;
	}
	slice->pic_height_in_mbs = (slice->seqparm->pic_height_in_map_units_minus1 + 1);
	if (!slice->seqparm->frame_mbs_only_flag)
		slice->pic_height_in_mbs *= 2;
	if (slice->field_pic_flag)
		slice->pic_height_in_mbs /= 2;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * slice->pic_height_in_mbs;
	if (str->dir == VS_DECODE) {
		slice->mbaff_frame_flag = slice->seqparm->mb_adaptive_frame_field_flag && !slice->field_pic_flag;
	}
	if (slice->idr_pic_flag) {
		if (vs_ue(str, &slice->idr_pic_id)) return 1;
	}
	switch (slice->seqparm->pic_order_cnt_type) {
		case 0:
			if (vs_u(str, &slice->pic_order_cnt_lsb, slice->seqparm->log2_max_pic_order_cnt_lsb_minus4 + 4)) return 1;
			if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt_bottom)) return 1;
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt_bottom, 0)) return 1;
			}
			break;
		case 1:
			if (!slice->seqparm->delta_pic_order_always_zero_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt[0])) return 1;
				if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
					if (vs_se(str, &slice->delta_pic_order_cnt[1])) return 1;
				} else {
					if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt[0], 0)) return 1;
				if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
			}
			break;
	}
	if (slice->picparm->redundant_pic_cnt_present_flag) {
		if (vs_ue(str, &slice->redundant_pic_cnt)) return 1;
	} else {
		if (vs_infer(str, &slice->redundant_pic_cnt, 0)) return 1;
	}
	if (!slice->seqparm->is_svc || slice->svc.quality_id == 0) {
		if (slice->slice_type == H264_SLICE_TYPE_B)
			if (vs_u(str, &slice->direct_spatial_mb_pred_flag, 1)) return 1;
		if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
			if (vs_u(str, &slice->num_ref_idx_active_override_flag, 1)) return 1;
			if (slice->num_ref_idx_active_override_flag) {
				if (vs_ue(str, &slice->num_ref_idx_l0_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_ue(str, &slice->num_ref_idx_l1_active_minus1)) return 1;
			} else {
				if (vs_infer(str, &slice->num_ref_idx_l0_active_minus1, slice->picparm->num_ref_idx_l0_default_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_infer(str, &slice->num_ref_idx_l1_active_minus1, slice->picparm->num_ref_idx_l1_default_active_minus1)) return 1;

			}
			if (slice->num_ref_idx_l0_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l0_active_minus1 out of range\n");
				return 1;
			}
			if (slice->num_ref_idx_l1_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l1_active_minus1 out of range\n");
				return 1;
			}
			/* ref_pic_list_modification */
			if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l0)) return 1;
			if (slice->slice_type == H264_SLICE_TYPE_B) {
				if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l1)) return 1;
			}
		}
		if ((slice->picparm->weighted_pred_flag && (slice->slice_type == H264_SLICE_TYPE_P || slice->slice_type == H264_SLICE_TYPE_SP)) || (slice->picparm->weighted_bipred_idc == 1 && slice->slice_type == H264_SLICE_TYPE_B)) {
			if (slice->seqparm->is_svc && !slice->svc.no_inter_layer_pred_flag) {
				if (vs_u(str, &slice->base_pred_weight_table_flag, 1)) return 1;
			} else {
				if (vs_infer(str, &slice->base_pred_weight_table_flag, 0)) return 1;
			}
			if (!slice->base_pred_weight_table_flag)
				if (h264_pred_weight_table(str, slice, &slice->pred_weight_table)) return 1;
		}
		if (slice->nal_ref_idc) {
			if (h264_dec_ref_pic_marking(str, slice->idr_pic_flag, &slice->dec_ref_pic_marking)) return 1;
			if (slice->seqparm->is_svc && !slice->seqparm->slice_header_restriction_flag) {
				if (h264_dec_ref_base_pic_marking(str, &slice->svc, &slice->dec_ref_base_pic_marking)) return 1;
			}
		}
	} else {
		/* XXX: infer me */
	}
	if (slice->picparm->entropy_coding_mode_flag && slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
		if (vs_ue(str, &slice->cabac_init_idc)) return 1;
		if (slice->cabac_init_idc > 2) {
			fprintf(stderr, "cabac_init_idc out of range!\n");
			return 1;
		}
	}
	if (vs_se(str, &slice->slice_qp_delta)) return 1;
	slice->sliceqpy = slice->picparm->pic_init_qp_minus26 + 26 + slice->slice_qp_delta;
	if (slice->slice_type == H264_SLICE_TYPE_SP)
		if (vs_u(str, &slice->sp_for_switch_flag, 1)) return 1;
	if (slice->slice_type == H264_SLICE_TYPE_SP || slice->slice_type == H264_SLICE_TYPE_SI)
		if (vs_se(str, &slice->slice_qs_delta)) return 1;
	if (slice->picparm->deblocking_filter_control_present_flag) {
		if (vs_ue(str, &slice->disable_deblocking_filter_idc)) return 1;
		if (slice->disable_deblocking_filter_idc != 1) {
			if (vs_se(str, &slice->slice_alpha_c0_offset_div2)) return 1;
			if (vs_se(str, &slice->slice_beta_offset_div2)) return 1;
		} else {
			if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
			if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->disable_deblocking_filter_idc, 0)) return 1;
		if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
		if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
	}
	if (slice->picparm->num_slice_groups_minus1 && slice->picparm->slice_group_map_type >= 3 && slice->picparm->slice_group_map_type <= 5)
		if (vs_u(str, &slice->slice_group_change_cycle, clog2(((slice->seqparm->pic_width_in_mbs_minus1 + 1) * (slice->seqparm->pic_height_in_map_units_minus1 + 1) + slice->picparm->slice_group_change_rate_minus1) / (slice->picparm->slice_group_change_rate_minus1 + 1) + 1))) return 1;
	if (slice->picparm->num_slice_groups_minus1)
		if (h264_prep_sgmap(slice)) return 1;
	if (slice->seqparm->is_svc) {
		/* XXX */
		fprintf(stderr, "SVC\n");
		return 1;
	}
	return 0;
}